

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O3

vector<Occupy,_std::allocator<Occupy>_> *
Common::analyzeOccupies
          (vector<Occupy,_std::allocator<Occupy>_> *__return_storage_ptr__,TaskHandle *head,
          size_t peak_memory,uint64_t origin_time)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Base_ptr this;
  _Rb_tree_header *p_Var2;
  pointer pOVar3;
  element_type *peVar4;
  TaskHandle *pTVar5;
  pointer pOVar6;
  pointer pOVar7;
  _Rb_tree_const_iterator<Occupy> __last;
  vector<Occupy,std::allocator<Occupy>> *pvVar8;
  uint64_t origin_time_00;
  bool bVar9;
  result_type_conflict rVar10;
  _Base_ptr p_Var11;
  ulong uVar12;
  ulong uVar13;
  undefined8 extraout_RAX;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  int iVar17;
  pointer pOVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  vector<Occupy,_std::allocator<Occupy>_> occupies_vec;
  anon_class_1_0_00000001 append;
  set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> essentials;
  set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> occupies;
  vector<Occupy,_std::allocator<Occupy>_> local_148;
  anon_class_1_0_00000001 local_121;
  _Rb_tree_const_iterator<Occupy> local_120;
  undefined1 local_118 [16];
  element_type *local_108;
  _Rb_tree_const_iterator<Occupy> local_100;
  vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_> local_f8;
  _Rb_tree<OperandUsage,_OperandUsage,_std::_Identity<OperandUsage>,_std::less<OperandUsage>,_std::allocator<OperandUsage>_>
  _Stack_e0;
  bool local_b0;
  double local_a8;
  double dStack_a0;
  vector<Occupy,std::allocator<Occupy>> *local_98;
  uint64_t local_90;
  size_t local_88;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_80;
  param_type local_78;
  _Rb_tree<Occupy,_Occupy,_std::_Identity<Occupy>,_std::less<Occupy>,_std::allocator<Occupy>_>
  local_70;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_40;
  param_type local_38;
  
  local_118._0_8_ = (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_118._8_8_ = (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count + 1;
    }
  }
  this = (_Base_ptr)(local_118 + 8);
  iVar17 = 0;
  local_90 = origin_time;
  if ((element_type *)local_118._0_8_ != (element_type *)0x0) {
    iVar20 = 1;
    iVar17 = 0;
    do {
      ((element_type *)local_118._0_8_)->time_stamp = iVar20;
      if (((element_type *)local_118._0_8_)->execution_memory == peak_memory) {
        iVar17 = iVar20;
      }
      pTVar5 = &((element_type *)local_118._0_8_)->next;
      local_118._0_8_ =
           (((element_type *)local_118._0_8_)->next).
           super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this,
                 &(pTVar5->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
      iVar20 = iVar20 + 1;
    } while ((element_type *)local_118._0_8_ != (element_type *)0x0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
  }
  if (iVar17 < 1) {
    __assert_fail("peak_time_stamp > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LyricZhao[P]DLMO/schedule.hpp"
                  ,0x235,
                  "static std::vector<Occupy> Common::analyzeOccupies(TaskHandle &, size_t, uint64_t)"
                 );
  }
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                       _M_pi;
  if (local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &((local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                  super__Vector_impl_data._M_finish)->gen).
                super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var1 = &((local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                  super__Vector_impl_data._M_finish)->gen).
                super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    }
  }
  local_120._M_node = this;
  local_98 = (vector<Occupy,std::allocator<Occupy>> *)__return_storage_ptr__;
  local_88 = peak_memory;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((element_type *)
      local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
      _M_start != (element_type *)0x0) {
    p_Var2 = &_Stack_e0._M_impl.super__Rb_tree_header;
    do {
      if (iVar17 < *(int *)((long)local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 0x90)) {
        pOVar3 = (((vector<OperandUsage,_std::allocator<OperandUsage>_> *)
                  ((long)local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x30))->
                 super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        peVar4 = (element_type *)local_118._0_8_;
        for (pOVar18 = (((vector<OperandUsage,_std::allocator<OperandUsage>_> *)
                        ((long)local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl
                               .super__Vector_impl_data._M_start + 0x30))->
                       super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>)._M_impl.
                       super__Vector_impl_data._M_start; local_118._0_8_ = peVar4, pOVar18 != pOVar3
            ; pOVar18 = pOVar18 + 1) {
          local_118._0_8_ =
               (pOVar18->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (((element_type *)local_118._0_8_ != (element_type *)0x0) &&
             (((element_type *)local_118._0_8_)->time_stamp < iVar17)) {
            local_118._8_8_ =
                 (pOVar18->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count
                     + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count
                     + 1;
              }
            }
            if (local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var1 = &((local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                            super__Vector_impl_data._M_finish)->gen).
                          super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
                *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
                UNLOCK();
              }
              else {
                p_Var1 = &((local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                            super__Vector_impl_data._M_finish)->gen).
                          super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
                *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
              }
            }
            _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            _Stack_e0._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_f8.
            super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            _Stack_e0._M_impl._0_8_ = 0;
            local_f8.
            super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_f8.
            super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            _Stack_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_b0 = false;
            local_a8 = 0.0;
            dStack_a0 = 0.0;
            local_108 = (element_type *)
                        local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                        super__Vector_impl_data._M_start;
            local_100._M_node =
                 (_Base_ptr)
                 local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
            _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
            if (local_70._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00129239:
              bVar9 = analyzeOccupies::anon_class_1_0_00000001::operator()
                                (&local_121,(Occupy *)local_118);
              if (bVar9) {
                std::
                _Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>
                ::_M_insert_unique<Occupy_const&>
                          ((_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>
                            *)&local_70,(Occupy *)local_118);
              }
            }
            else {
              p_Var11 = local_70._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var16 = &local_70._M_impl.super__Rb_tree_header._M_header;
              do {
                p_Var15 = p_Var16;
                p_Var14 = p_Var11;
                peVar4 = *(element_type **)(p_Var14 + 1);
                p_Var16 = p_Var14;
                if (peVar4 < (ulong)local_118._0_8_) {
                  p_Var16 = p_Var15;
                }
                p_Var11 = (&p_Var14->_M_left)[peVar4 < (ulong)local_118._0_8_];
              } while ((&p_Var14->_M_left)[peVar4 < (ulong)local_118._0_8_] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var16 == &local_70._M_impl.super__Rb_tree_header)
              goto LAB_00129239;
              if (peVar4 < (ulong)local_118._0_8_) {
                p_Var14 = p_Var15;
              }
              if ((ulong)local_118._0_8_ < *(element_type **)(p_Var14 + 1)) goto LAB_00129239;
            }
            std::
            _Rb_tree<OperandUsage,_OperandUsage,_std::_Identity<OperandUsage>,_std::less<OperandUsage>,_std::allocator<OperandUsage>_>
            ::~_Rb_tree(&_Stack_e0);
            std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>::~vector
                      (&local_f8);
            if ((pointer)local_100._M_node != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._M_node);
            }
            peVar4 = (element_type *)local_118._0_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
              peVar4 = (element_type *)local_118._0_8_;
            }
          }
          local_118._0_8_ = peVar4;
          peVar4 = (element_type *)local_118._0_8_;
        }
      }
      pTVar5 = &((element_type *)
                local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                super__Vector_impl_data._M_start)->next;
      local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(((element_type *)
                           local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                           super__Vector_impl_data._M_start)->next).
                          super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                  super__Vector_impl_data._M_finish,
                 &(pTVar5->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    } while ((element_type *)
             local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
             super__Vector_impl_data._M_start != (element_type *)0x0);
  }
  if (local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  origin_time_00 = local_90;
  local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((_Rb_tree_header *)local_70._M_impl.super__Rb_tree_header._M_header._M_left ==
      &local_70._M_impl.super__Rb_tree_header) {
    local_120._M_node = (_Base_ptr)(local_118 + 8);
    local_118._8_8_ = local_118._8_8_ & 0xffffffff00000000;
    local_108 = (element_type *)0x0;
    local_f8.super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_100._M_node = local_120._M_node;
    local_f8.super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_120._M_node;
  }
  else {
    p_Var11 = local_70._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      Occupy::Occupy((Occupy *)local_118,(Occupy *)(p_Var11 + 1));
      Occupy::calculate((Occupy *)local_118,iVar17,local_88,origin_time_00);
      std::vector<Occupy,_std::allocator<Occupy>_>::push_back(&local_148,(Occupy *)local_118);
      std::
      _Rb_tree<OperandUsage,_OperandUsage,_std::_Identity<OperandUsage>,_std::less<OperandUsage>,_std::allocator<OperandUsage>_>
      ::~_Rb_tree(&_Stack_e0);
      std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>::~vector
                (&local_f8);
      if ((pointer)local_100._M_node != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._M_node);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      pOVar7 = local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pOVar6 = local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while ((_Rb_tree_header *)p_Var11 != &local_70._M_impl.super__Rb_tree_header);
    local_118._8_8_ = local_118._8_8_ & 0xffffffff00000000;
    local_108 = (element_type *)0x0;
    local_100._M_node = (_Base_ptr)(local_118 + 8);
    local_f8.super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_100._M_node;
    if (local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar12 = (long)local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                     super__Vector_impl_data._M_start >> 7;
      lVar19 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Occupy*,std::vector<Occupy,std::allocator<Occupy>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Common::analyzeOccupies(std::shared_ptr<Task>&,unsigned_long,unsigned_long)::_lambda(Occupy_const&,Occupy_const&)_1_>>
                (local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<Occupy*,std::vector<Occupy,std::allocator<Occupy>>>,__gnu_cxx::__ops::_Iter_comp_iter<Common::analyzeOccupies(std::shared_ptr<Task>&,unsigned_long,unsigned_long)::_lambda(Occupy_const&,Occupy_const&)_1_>>
                (pOVar6,pOVar7);
    }
  }
  uVar12 = (long)local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                 super__Vector_impl_data._M_start;
  iVar17 = (int)(uVar12 >> 7);
  if (0 < iVar17) {
    lVar21 = (ulong)(iVar17 != 1) + 1;
    lVar19 = 0;
    do {
      std::_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>::
      _M_insert_unique<Occupy_const&>
                ((_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>
                  *)local_118,
                 (Occupy *)
                 ((long)&((local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                           super__Vector_impl_data._M_start)->gen).
                         super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr + lVar19));
      lVar19 = lVar19 + 0x80;
      lVar21 = lVar21 + -1;
    } while (lVar21 != 0);
  }
  pOVar7 = local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pOVar6 = local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar13 = (long)local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                   super__Vector_impl_data._M_start >> 7;
    lVar19 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar19 == 0; lVar19 = lVar19 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Occupy*,std::vector<Occupy,std::allocator<Occupy>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Common::analyzeOccupies(std::shared_ptr<Task>&,unsigned_long,unsigned_long)::_lambda(Occupy_const&,Occupy_const&)_2_>>
              (local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Occupy*,std::vector<Occupy,std::allocator<Occupy>>>,__gnu_cxx::__ops::_Iter_comp_iter<Common::analyzeOccupies(std::shared_ptr<Task>&,unsigned_long,unsigned_long)::_lambda(Occupy_const&,Occupy_const&)_2_>>
              (pOVar6,pOVar7);
  }
  if (0 < iVar17) {
    lVar21 = (ulong)(iVar17 != 1) + 1;
    lVar19 = 0;
    do {
      std::_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>::
      _M_insert_unique<Occupy_const&>
                ((_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>
                  *)local_118,
                 (Occupy *)
                 ((long)&((local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                           super__Vector_impl_data._M_start)->gen).
                         super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr + lVar19));
      lVar19 = lVar19 + 0x80;
      lVar21 = lVar21 + -1;
    } while (lVar21 != 0);
  }
  __last._M_node = local_120._M_node;
  local_80._M_x = 1;
  local_78._M_a = 0;
  local_78._M_b = 0;
  if ((local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data
       ._M_start !=
       local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data
       ._M_finish) &&
     (rVar10 = std::uniform_int_distribution<int>::operator()
                         ((uniform_int_distribution<int> *)&local_78,&local_80,&local_78),
     rVar10 == 0)) {
    if (iVar17 < 1) {
      error("Min value should be less than max.\n");
      std::
      _Rb_tree<Occupy,_Occupy,_std::_Identity<Occupy>,_std::less<Occupy>,_std::allocator<Occupy>_>::
      ~_Rb_tree((_Rb_tree<Occupy,_Occupy,_std::_Identity<Occupy>,_std::less<Occupy>,_std::allocator<Occupy>_>
                 *)local_118);
      std::vector<Occupy,_std::allocator<Occupy>_>::~vector(&local_148);
      std::
      _Rb_tree<Occupy,_Occupy,_std::_Identity<Occupy>,_std::less<Occupy>,_std::allocator<Occupy>_>::
      ~_Rb_tree(&local_70);
      _Unwind_Resume(extraout_RAX);
    }
    local_40._M_x = 1;
    local_38 = (param_type)((uVar12 & 0xffffffffffffff80) * 0x2000000 + -0x100000000);
    rVar10 = std::uniform_int_distribution<int>::operator()
                       ((uniform_int_distribution<int> *)&local_38,&local_40,&local_38);
    std::_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>::
    _M_insert_unique<Occupy_const&>
              ((_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>
                *)local_118,
               local_148.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
               super__Vector_impl_data._M_start + rVar10);
  }
  pvVar8 = local_98;
  std::vector<Occupy,std::allocator<Occupy>>::vector<std::_Rb_tree_const_iterator<Occupy>,void>
            (local_98,local_100,__last,(allocator_type *)&local_40);
  std::_Rb_tree<Occupy,_Occupy,_std::_Identity<Occupy>,_std::less<Occupy>,_std::allocator<Occupy>_>
  ::~_Rb_tree((_Rb_tree<Occupy,_Occupy,_std::_Identity<Occupy>,_std::less<Occupy>,_std::allocator<Occupy>_>
               *)local_118);
  std::vector<Occupy,_std::allocator<Occupy>_>::~vector(&local_148);
  std::_Rb_tree<Occupy,_Occupy,_std::_Identity<Occupy>,_std::less<Occupy>,_std::allocator<Occupy>_>
  ::~_Rb_tree(&local_70);
  return (vector<Occupy,_std::allocator<Occupy>_> *)pvVar8;
}

Assistant:

static std::vector<Occupy> analyzeOccupies(TaskHandle &head, size_t peak_memory, uint64_t origin_time) {
        // Run this function after running analyzeTopology and analyzeMemory
        // Mark tasks and get the peak one
        int time_stamp = 0, peak_time_stamp = 0;
        LOOP(task, head) {
            task->time_stamp = ++ time_stamp;
            if (task->execution_memory == peak_memory) {
                peak_time_stamp = time_stamp;
            }
        }
        assert(peak_time_stamp > 0);

        // Check
        auto append = [](Occupy &occupy) -> bool {
            auto &gen = occupy.gen;
            auto &use = occupy.use;
            occupy.re_gen_ins.insert(gen->ins.begin(), gen->ins.end());

            // We're going to put `gen` before `use`, so we must ensure the inputs of `gen` will not change
            static constexpr int RE_GEN_TASK_LIMIT = 3;
            for (int i = -1; i < RE_GEN_TASK_LIMIT; ++ i) {
                bool found = false;
                OperandUsage bad_usage;
                for (auto &usage: occupy.re_gen_ins) {
                    auto last_gen_before_re_gen = usage.next_gen;
                    while (last_gen_before_re_gen) {
                        auto &re_gen = last_gen_before_re_gen->find(usage.operand);
                        if (re_gen.next_gen and re_gen.next_gen->time_stamp < use->time_stamp) {
                            last_gen_before_re_gen = re_gen.next_gen;
                        } else {
                            break;
                        }
                    }
                    if (last_gen_before_re_gen and last_gen_before_re_gen->time_stamp < use->time_stamp) {
                        auto &re_gen = last_gen_before_re_gen->find(usage.operand);
                        if (re_gen.version != usage.version) {
                            found = true;
                            bad_usage = usage;
                            break;
                        }
                    }
                }
                if (found) {
                    occupy.re_gen.push_back(bad_usage.gen);
                    occupy.re_gen_ins.erase(bad_usage);
                    occupy.re_gen_ins.insert(bad_usage.gen->ins.begin(), bad_usage.gen->ins.end());
                } else {
                    return true;
                }
            }
            return false;
        };

        // Get all occupying pairs
        std::set<Occupy> occupies;
        LOOP(task, head) {
            if (peak_time_stamp >= task->time_stamp) {
                continue;
            }
            for (auto &usage: task->ins) {
                if (usage.gen and usage.gen->time_stamp < peak_time_stamp) {
                    auto occupy = Occupy {usage.gen, task};
                    // .count is a must, because we only accept the first usage
                    if (not occupies.count(occupy) and append(occupy)) {
                        occupies.insert(occupy);
                    }
                }
            }
        }

        // Get scores
        std::vector<Occupy> occupies_vec;
        for (auto &occupy: occupies) {
            auto copied = occupy;
            copied.calculate(peak_time_stamp, peak_memory, origin_time);
            occupies_vec.push_back(copied);
        }

        // O1 Pruning
        std::set<Occupy> essentials;
        std::sort(occupies_vec.begin(), occupies_vec.end(), [](const Occupy &o1, const Occupy &o2) {
            return o1.score1 < o2.score1;
        });
        int size = occupies_vec.size();
        for (int i = 0; i < size and i < O1_OCCUPIES_LIMIT; ++ i) {
            // printf(" > s1: %.3lf s2: %.3lf\n", occupies_vec[i].score1, occupies_vec[i].score2);
            essentials.insert(occupies_vec[i]);
        }

        // O2 Pruning
        std::sort(occupies_vec.begin(), occupies_vec.end(), [](const Occupy &o1, const Occupy &o2) {
            return o1.score2 < o2.score2;
        });
        for (int i = 0; i < size and i < O2_OCCUPIES_LIMIT; ++ i) {
            // printf(" > s1: %.3lf s2: %.3lf\n", occupies_vec[i].score1, occupies_vec[i].score2);
            essentials.insert(occupies_vec[i]);
        }

        // Random
        auto random = Random(0, TIMES_PER_RANDOM);
        if (not occupies_vec.empty() and random() == 0) {
            auto pos = Random(0, size)();
            essentials.insert(occupies_vec[pos]);
        }

        return std::vector<Occupy>(essentials.begin(), essentials.end());
    }